

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,uint64_t n)

{
  _Base_ptr p_Var1;
  bool bVar2;
  reference ppSVar3;
  _Self local_98;
  key_type local_90;
  _Self local_88;
  iterator it_returned;
  key_type local_78;
  _Self local_70;
  iterator it_normal;
  Span *best;
  Span bound;
  uint64_t n_local;
  PageHeap *this_local;
  
  bound.location = n;
  Span::Span((Span *)&best);
  bound.page_id = bound.location;
  bound.next = (Span *)0x0;
  it_normal._M_node = (_Base_ptr)0x0;
  local_78 = (key_type)&best;
  local_70._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::upper_bound(&this->large_normal_,&local_78);
  it_returned = std::
                set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                ::end(&this->large_normal_);
  bVar2 = std::operator!=(&local_70,&it_returned);
  if (bVar2) {
    ppSVar3 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    it_normal._M_node = (_Base_ptr)*ppSVar3;
  }
  local_90 = (key_type)&best;
  local_88._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::upper_bound(&this->large_returned_,&local_90);
  local_98._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::end(&this->large_returned_);
  bVar2 = std::operator!=(&local_88,&local_98);
  if ((bVar2) &&
     ((it_normal._M_node == (_Base_ptr)0x0 ||
      (p_Var1 = (it_normal._M_node)->_M_right,
      ppSVar3 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_88),
      (_Base_ptr)(*ppSVar3)->npages < p_Var1)))) {
    ppSVar3 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_88);
    it_normal._M_node = (_Base_ptr)*ppSVar3;
  }
  if (it_normal._M_node != (_Base_ptr)0x0) {
    RemoveFromFreeList(this,(Span *)it_normal._M_node);
  }
  bVar2 = CheckSmallList(this);
  if (bVar2) {
    return (Span *)it_normal._M_node;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0xca,"Span *tcmalloc::PageHeap::AllocLarge(uint64_t)");
}

Assistant:

Span* AllocLarge(uint64_t n) {
        Span bound;
        bound.npages = n;
        bound.page_id = 0;
        Span* best = nullptr;

        auto it_normal = large_normal_.upper_bound(&bound);
        if (it_normal != large_normal_.end()) {
            best = *it_normal;
        }

        auto it_returned = large_returned_.upper_bound(&bound);
        if (it_returned != large_returned_.end()) {
            if (best == nullptr || best->npages > (*it_returned)->npages) {
                best = *it_returned;
            }
        }

        if (best != nullptr) {
            RemoveFromFreeList(best);
        }
        assert(CheckSmallList());
        return best;
    }